

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_longints
          (TensorValue *this,TensorValue_RepeatedLongInts *longints)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  TensorValue_RepeatedLongInts *longints_local;
  TensorValue *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  clear_value(this);
  if (longints != (TensorValue_RepeatedLongInts *)0x0) {
    submessage_arena_00 =
         google::protobuf::Arena::
         InternalHelper<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>::
         GetOwningArena(longints);
    message_arena = (Arena *)longints;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::
                    GetOwnedMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                              (message_arena_00,longints,submessage_arena_00);
    }
    set_has_longints(this);
    (this->value_).floats_ = (TensorValue_RepeatedFloats *)message_arena;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_longints(::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts* longints) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (longints) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>::GetOwningArena(longints);
    if (message_arena != submessage_arena) {
      longints = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, longints, submessage_arena);
    }
    set_has_longints();
    value_.longints_ = longints;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.longInts)
}